

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_caster<std::shared_ptr<kratos::Var>,_void> *
pybind11::detail::load_type<std::shared_ptr<kratos::Var>,void>
          (type_caster<std::shared_ptr<kratos::Var>,_void> *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  str local_28;
  
  bVar1 = type_caster_generic::
          load_impl<pybind11::detail::copyable_holder_caster<kratos::Var,std::shared_ptr<kratos::Var>,void>>
                    ((type_caster_generic *)conv,(handle)handle->m_ptr,true);
  if (bVar1) {
    return conv;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  pybind11::str::str(&local_28,(PyObject *)handle->m_ptr->ob_type);
  pybind11::str::operator_cast_to_string(&local_68,&local_28);
  std::operator+(&local_88,"Unable to cast Python instance of type ",&local_68);
  std::operator+(&local_a8,&local_88," to C++ type \'");
  type_id<std::shared_ptr<kratos::Var>>();
  std::operator+(&local_c8,&local_a8,&local_48);
  std::operator+(&local_e8,&local_c8,"\'");
  cast_error::runtime_error(this,&local_e8);
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(type::handle_of(handle)) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}